

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_d.h
# Opt level: O0

Scalar_conflict1 __thiscall draco::VectorD<long,_3>::AbsSum(VectorD<long,_3> *this)

{
  int iVar1;
  const_reference pvVar2;
  undefined4 extraout_var;
  long lVar3;
  array<long,_3UL> *in_RDI;
  Scalar_conflict1 next_value;
  int i;
  Scalar_conflict1 result;
  size_type in_stack_ffffffffffffffc8;
  int local_1c;
  size_type local_18;
  
  local_18 = 0;
  local_1c = 0;
  while( true ) {
    if (2 < local_1c) {
      return local_18;
    }
    pvVar2 = std::array<long,_3UL>::operator[](in_RDI,in_stack_ffffffffffffffc8);
    iVar1 = std::abs((int)*pvVar2);
    in_stack_ffffffffffffffc8 = local_18;
    lVar3 = std::numeric_limits<long>::max();
    if (lVar3 - CONCAT44(extraout_var,iVar1) < (long)in_stack_ffffffffffffffc8) break;
    local_18 = CONCAT44(extraout_var,iVar1) + local_18;
    local_1c = local_1c + 1;
  }
  lVar3 = std::numeric_limits<long>::max();
  return lVar3;
}

Assistant:

Scalar AbsSum() const {
    Scalar result(0);
    for (int i = 0; i < dimension; ++i) {
      Scalar next_value = std::abs(v_[i]);
      if (result > std::numeric_limits<Scalar>::max() - next_value) {
        // Return the max if adding would have caused an overflow.
        return std::numeric_limits<Scalar>::max();
      }
      result += next_value;
    }
    return result;
  }